

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_rep_timespec.cc
# Opt level: O3

nsync_time nsync::nsync_from_time_point_(nsync_cpp_time_point_ tp)

{
  nsync_time nVar1;
  
  nVar1.tv_nsec = (long)tp.__d.__r % 1000000000;
  nVar1.tv_sec = (long)tp.__d.__r / 1000000000;
  return nVar1;
}

Assistant:

nsync_time nsync_from_time_point_ (nsync_cpp_time_point_ tp) {
        /* std::chrono::system_clock::to_time_t() says that "[i]t is implementation
           defined whether values are rounded or truncated to the required
           precision", which is a little tricky to use.
           Assume instead that the epoch for std::chrono::system_clock::time_point is
           the same as that for a struct timespec.  This seems to be true on at
           least Linux, NetBSD, MacOS, and Win32; and with 64 bits gives
	   us an implementation that will work for over 200 years.   By then,
	   we'll be able to call C++17's timespec_get.  */
        int64_t ns = std::chrono::duration_cast<std::chrono::nanoseconds>(
                tp.time_since_epoch ()).count();
	struct timespec ts;
	memset (&ts, 0, sizeof (ts));
	ts.tv_sec = ns / NSYNC_NS_IN_S_;
	ts.tv_nsec = (long) (ns - ts.tv_sec * NSYNC_NS_IN_S_);
	return (ts);
}